

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::mergefacets(tetgenmesh *this)

{
  int iVar1;
  int iVar2;
  arraypool *paVar3;
  point pdVar4;
  point pdVar5;
  point pdVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int local_128;
  int local_124;
  int j;
  int i;
  double cosang2;
  double cosang1;
  face seg2;
  face seg1;
  face shloop;
  double cosang_sep_tol;
  double *paryang;
  arraypool *local_c0;
  arraypool *dihedangarray;
  double cosang_tol;
  double cosang;
  double n2 [3];
  double local_88;
  double n1 [3];
  point pd;
  point pc;
  point pb;
  point pa;
  face segloop;
  face neineish;
  face neighsh;
  face parentsh;
  tetgenmesh *this_local;
  
  face::face((face *)&neighsh.shver);
  face::face((face *)&neineish.shver);
  face::face((face *)&segloop.shver);
  face::face((face *)&pa);
  paVar3 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(paVar3,8,10);
  cosang_sep_tol = 0.0;
  local_c0 = paVar3;
  dihedangarray = (arraypool *)cos((this->b->facet_separate_ang_tol / 180.0) * PI);
  memorypool::traversalinit(this->subsegs);
  pa = (point)shellfacetraverse(this,this->subsegs);
  while (pa != (point)0x0) {
    iVar1 = shellmark(this,(face *)&pa);
    if (iVar1 == -1) {
      spivot(this,(face *)&pa,(face *)&neighsh.shver);
      if (((neighsh._8_8_ != 0) &&
          (spivot(this,(face *)&neighsh.shver,(face *)&neineish.shver), neineish._8_8_ != 0)) &&
         (spivot(this,(face *)&neineish.shver,(face *)&segloop.shver),
         segloop._8_8_ == neighsh._8_8_)) {
        iVar1 = shellmark(this,(face *)&neighsh.shver);
        iVar2 = shellmark(this,(face *)&neineish.shver);
        if (iVar1 == iVar2) {
          pdVar4 = sorg(this,(face *)&pa);
          pdVar5 = sdest(this,(face *)&pa);
          pdVar6 = sapex(this,(face *)&neighsh.shver);
          n1[2] = (double)sapex(this,(face *)&neineish.shver);
          facenormal(this,pdVar4,pdVar5,pdVar6,&local_88,1,(double *)0x0);
          facenormal(this,pdVar4,pdVar5,(point)n1[2],&cosang,1,(double *)0x0);
          dVar7 = dot(this,&local_88,&cosang);
          dVar8 = dot(this,&local_88,&local_88);
          dVar8 = sqrt(dVar8);
          dVar9 = dot(this,&cosang,&cosang);
          dVar9 = sqrt(dVar9);
          cosang_tol = dVar7 / (dVar8 * dVar9);
          if ((double)dihedangarray <= cosang_tol) {
            arraypool::newindex(local_c0,(void **)&cosang_sep_tol);
            *(double *)cosang_sep_tol = cosang_tol;
            pa[6] = cosang_sep_tol;
          }
          else {
            ssdissolve(this,(face *)&neighsh.shver);
            ssdissolve(this,(face *)&neineish.shver);
            shellfacedealloc(this,this->subsegs,(shellface *)pa);
            flipshpush(this,(face *)&neighsh.shver);
          }
        }
      }
      pa = (point)shellfacetraverse(this,this->subsegs);
    }
    else {
      pa = (point)shellfacetraverse(this,this->subsegs);
    }
  }
  dihedangarray = (arraypool *)cos((this->b->facet_small_ang_tol / 180.0) * PI);
  dVar7 = cos(((this->b->facet_separate_ang_tol - 5.0) / 180.0) * PI);
  face::face((face *)&seg1.shver);
  face::face((face *)&seg2.shver);
  face::face((face *)&cosang1);
  memorypool::traversalinit(this->subfaces);
  seg1._8_8_ = shellfacetraverse(this,this->subfaces);
  do {
    paVar3 = local_c0;
    if (seg1._8_8_ == 0) {
      if (local_c0 != (arraypool *)0x0) {
        arraypool::~arraypool(local_c0);
        operator_delete(paVar3,0x30);
      }
      if (this->flipstack != (badface *)0x0) {
        lawsonflip(this);
      }
      return;
    }
    for (local_124 = 0; local_124 < 3; local_124 = local_124 + 1) {
      if ((*(long *)(seg1._8_8_ + (long)(((int)shloop.sh >> 1) + 6) * 8) != 0) &&
         (senext(this,(face *)&seg1.shver,(face *)&neineish.shver),
         *(long *)(neineish._8_8_ + (long)(((int)neighsh.sh >> 1) + 6) * 8) != 0)) {
        pdVar4 = sorg(this,(face *)&seg1.shver);
        pdVar5 = sdest(this,(face *)&seg1.shver);
        pdVar6 = sapex(this,(face *)&seg1.shver);
        for (local_128 = 0; local_128 < 3; local_128 = local_128 + 1) {
          n1[(long)local_128 + -1] = pdVar4[local_128] - pdVar5[local_128];
        }
        for (local_128 = 0; local_128 < 3; local_128 = local_128 + 1) {
          n2[(long)local_128 + -1] = pdVar6[local_128] - pdVar5[local_128];
        }
        dVar8 = dot(this,&local_88,&cosang);
        dVar9 = dot(this,&local_88,&local_88);
        dVar9 = sqrt(dVar9);
        dVar10 = dot(this,&cosang,&cosang);
        dVar10 = sqrt(dVar10);
        cosang_tol = dVar8 / (dVar9 * dVar10);
        if ((double)dihedangarray < cosang_tol) {
          pa = (point)0x0;
          sspivot(this,(face *)&seg1.shver,(face *)&seg2.shver);
          sspivot(this,(face *)&neineish.shver,(face *)&cosang1);
          if (*(long *)(seg2._8_8_ + 0x30) == 0) {
            cosang2 = 1.0;
          }
          else {
            cosang_sep_tol = *(double *)(seg2._8_8_ + 0x30);
            cosang2 = *(double *)cosang_sep_tol;
          }
          if (*(long *)((long)cosang1 + 0x30) == 0) {
            _j = 1.0;
          }
          else {
            cosang_sep_tol = *(double *)((long)cosang1 + 0x30);
            _j = *(double *)cosang_sep_tol;
          }
          if (dVar7 <= cosang2) {
            if (_j < dVar7) {
              face::operator=((face *)&pa,(face *)&cosang1);
            }
          }
          else if (dVar7 <= _j) {
            face::operator=((face *)&pa,(face *)&seg2.shver);
          }
          else if (_j <= cosang2) {
            face::operator=((face *)&pa,(face *)&cosang1);
          }
          else {
            face::operator=((face *)&pa,(face *)&seg2.shver);
          }
          if (pa != (point)0x0) {
            segloop.sh._0_4_ = 0;
            spivot(this,(face *)&pa,(face *)&neighsh.shver);
            spivot(this,(face *)&neighsh.shver,(face *)&neineish.shver);
            ssdissolve(this,(face *)&neighsh.shver);
            ssdissolve(this,(face *)&neineish.shver);
            shellfacedealloc(this,this->subsegs,(shellface *)pa);
            flipshpush(this,(face *)&neighsh.shver);
            break;
          }
        }
      }
      senextself(this,(face *)&seg1.shver);
    }
    seg1._8_8_ = shellfacetraverse(this,this->subfaces);
  } while( true );
}

Assistant:

void tetgenmesh::mergefacets()
{
  face parentsh, neighsh, neineish;
  face segloop;
  point pa, pb, pc, pd;
  REAL n1[3], n2[3];
  REAL cosang, cosang_tol;


  // Allocate an array to save calcaulated dihedral angles at segments.
  arraypool *dihedangarray = new arraypool(sizeof(double), 10);
  REAL *paryang = NULL;

  // First, remove coplanar segments.
  // The dihedral angle bound for two different facets.
  cosang_tol = cos(b->facet_separate_ang_tol / 180.0 * PI);

  subsegs->traversalinit();
  segloop.sh = shellfacetraverse(subsegs);
  while (segloop.sh != (shellface *) NULL) {
    // Only remove a segment if it has a marker '-1'.
    if (shellmark(segloop) != -1) {
      segloop.sh = shellfacetraverse(subsegs);
      continue;
    }
    spivot(segloop, parentsh);
    if (parentsh.sh != NULL) {
      spivot(parentsh, neighsh);
      if (neighsh.sh != NULL) {
        spivot(neighsh, neineish);
        if (neineish.sh == parentsh.sh) {
          // Exactly two subfaces at this segment.
          // Only merge them if they have the same boundary marker.
          if (shellmark(parentsh) == shellmark(neighsh)) {
            pa = sorg(segloop);
            pb = sdest(segloop);
            pc = sapex(parentsh);
            pd = sapex(neighsh);
            // Calculate the dihedral angle at the segment [a,b].
            facenormal(pa, pb, pc, n1, 1, NULL);
            facenormal(pa, pb, pd, n2, 1, NULL);
            cosang = dot(n1, n2) / (sqrt(dot(n1, n1)) * sqrt(dot(n2, n2)));
            if (cosang < cosang_tol) {
              ssdissolve(parentsh);
              ssdissolve(neighsh);
              shellfacedealloc(subsegs, segloop.sh);
              // Add the edge to flip stack.
              flipshpush(&parentsh);
            } else {
              // Save 'cosang' to avoid re-calculate it.
              // Re-use the pointer at the first segment.
              dihedangarray->newindex((void **) &paryang);
              *paryang = cosang;
              segloop.sh[6] = (shellface) paryang;
            }
          } 
        } // if (neineish.sh == parentsh.sh)
      }
    }
    segloop.sh = shellfacetraverse(subsegs);
  }

  // Second, remove ridge segments at small angles.
  // The dihedral angle bound for two different facets.
  cosang_tol = cos(b->facet_small_ang_tol / 180.0 * PI);
  REAL cosang_sep_tol = cos((b->facet_separate_ang_tol - 5.0) / 180.0 * PI);
  face shloop;
  face seg1, seg2;
  REAL cosang1, cosang2;
  int i, j;

  subfaces->traversalinit();
  shloop.sh = shellfacetraverse(subfaces);
  while (shloop.sh != (shellface *) NULL) {
    for (i = 0; i < 3; i++) {
      if (isshsubseg(shloop)) {
        senext(shloop, neighsh);
        if (isshsubseg(neighsh)) {
          // Found two segments sharing at one vertex.
          // Check if they form a small angle.
          pa = sorg(shloop);
          pb = sdest(shloop);
          pc = sapex(shloop);
          for (j = 0; j < 3; j++) n1[j] = pa[j] - pb[j];
          for (j = 0; j < 3; j++) n2[j] = pc[j] - pb[j];
          cosang = dot(n1, n2) / (sqrt(dot(n1, n1)) * sqrt(dot(n2, n2)));
          if (cosang > cosang_tol) {
            // Found a small angle.
            segloop.sh = NULL;
            sspivot(shloop, seg1);
            sspivot(neighsh, seg2);
            if (seg1.sh[6] != NULL) {
              paryang = (REAL *) (seg1.sh[6]);
              cosang1 = *paryang;
            } else {
              cosang1 = 1.0; // 0 degree;
            }
            if (seg2.sh[6] != NULL) {
              paryang = (REAL *) (seg2.sh[6]);
              cosang2 = *paryang;
            } else {
              cosang2 = 1.0; // 0 degree;
            }
            if (cosang1 < cosang_sep_tol) {
              if (cosang2 < cosang_sep_tol) {
                if (cosang1 < cosang2) {
                  segloop = seg1;
                } else {
                  segloop = seg2;
                }
              } else {
                segloop = seg1;
              }
            } else {
              if (cosang2 < cosang_sep_tol) {
                segloop = seg2;
              }
            }
            if (segloop.sh != NULL) {
              // Remove this segment.
              segloop.shver = 0;
              spivot(segloop, parentsh);
              spivot(parentsh, neighsh);
              ssdissolve(parentsh);
              ssdissolve(neighsh);
              shellfacedealloc(subsegs, segloop.sh);
              // Add the edge to flip stack.
              flipshpush(&parentsh);
              break;
            }
          }
        } // if (isshsubseg)
      } // if (isshsubseg)
      senextself(shloop);
    }
    shloop.sh = shellfacetraverse(subfaces);
  }

  delete dihedangarray;

  if (flipstack != NULL) {
    lawsonflip(); // Recover Delaunayness.
  }
}